

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS
ref_interp_scalar(REF_INTERP ref_interp,REF_INT leading_dim,REF_DBL *from_scalar,REF_DBL *to_scalar)

{
  int iVar1;
  REF_NODE ref_node;
  REF_MPI pRVar2;
  uint uVar3;
  REF_INT RVar4;
  ulong uVar5;
  void *pvVar6;
  REF_INT *proc;
  ulong uVar7;
  long lVar8;
  REF_DBL *pRVar9;
  undefined8 uVar10;
  ulong uVar11;
  uint uVar12;
  size_t __size;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  double dVar17;
  REF_INT n_donor;
  uint local_11c;
  void *local_118;
  REF_DBL *local_110;
  void *local_108;
  REF_INT *local_100;
  void *local_f8;
  REF_MPI local_f0;
  REF_INT *donor_ret;
  REF_CELL local_e0;
  REF_INT *recept_node;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_scalar;
  REF_DBL *local_b8;
  REF_INT *donor_cell;
  REF_INT nodes [27];
  
  ref_node = ref_interp->to_grid->node;
  uVar3 = ref_node->max;
  uVar5 = 0;
  uVar7 = 0;
  if (0 < (int)uVar3) {
    uVar7 = (ulong)uVar3;
  }
  uVar12 = 0;
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    if ((-1 < ref_node->global[uVar5]) && (ref_node->ref_mpi->id == ref_node->part[uVar5])) {
      uVar12 = uVar12 + 1;
      local_11c = uVar12;
    }
  }
  if ((int)uVar12 < 0) {
    pcVar15 = "malloc recept_bary of REF_DBL negative";
    uVar10 = 0x81e;
LAB_001301f3:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar10
           ,"ref_interp_scalar",pcVar15);
    return 1;
  }
  local_f0 = ref_interp->to_grid->mpi;
  local_e0 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
  local_b8 = from_scalar;
  pvVar6 = malloc((ulong)(uVar12 * 4) << 3);
  if (pvVar6 == (void *)0x0) {
    pcVar15 = "malloc recept_bary of REF_DBL NULL";
    uVar10 = 0x81e;
  }
  else {
    __size = (ulong)uVar12 << 2;
    local_118 = pvVar6;
    pvVar6 = malloc(__size);
    if (pvVar6 == (void *)0x0) {
      pcVar15 = "malloc recept_cell of REF_INT NULL";
      uVar10 = 0x81f;
    }
    else {
      local_f8 = pvVar6;
      recept_node = (REF_INT *)malloc(__size);
      if (recept_node == (REF_INT *)0x0) {
        pcVar15 = "malloc recept_node of REF_INT NULL";
        uVar10 = 0x820;
      }
      else {
        local_100 = recept_node;
        pvVar6 = malloc(__size);
        if (pvVar6 == (void *)0x0) {
          pcVar15 = "malloc recept_ret of REF_INT NULL";
          uVar10 = 0x821;
        }
        else {
          local_108 = pvVar6;
          proc = (REF_INT *)malloc(__size);
          if (proc != (REF_INT *)0x0) {
            local_11c = 0;
            lVar16 = 0;
            uVar12 = 0;
            local_110 = to_scalar;
            for (lVar13 = 0; pRVar2 = local_f0, lVar13 < (int)uVar3; lVar13 = lVar13 + 1) {
              if ((-1 < ref_node->global[lVar13]) &&
                 (ref_node->ref_mpi->id == ref_node->part[lVar13])) {
                if (ref_interp->cell[lVar13] == -1) {
                  pcVar15 = "node needs to be localized";
                  uVar10 = 0x827;
                  goto LAB_001301f3;
                }
                uVar3 = ref_node_clip_bary4((REF_DBL *)((long)ref_interp->bary + lVar16),
                                            (REF_DBL *)
                                            ((long)local_118 + (long)(int)(uVar12 * 4) * 8));
                if (uVar3 != 0) {
                  pcVar15 = "clip";
                  uVar10 = 0x82a;
                  goto LAB_00130411;
                }
                lVar8 = (long)(int)uVar12;
                proc[lVar8] = ref_interp->part[lVar13];
                *(REF_INT *)((long)local_f8 + lVar8 * 4) = ref_interp->cell[lVar13];
                local_100[lVar8] = (REF_INT)lVar13;
                *(REF_INT *)((long)local_108 + lVar8 * 4) = local_f0->id;
                uVar12 = uVar12 + 1;
                uVar3 = ref_node->max;
                local_11c = uVar12;
              }
              lVar16 = lVar16 + 0x20;
            }
            uVar3 = ref_mpi_blindsend(local_f0,proc,local_f8,1,uVar12,&donor_cell,&n_donor,1);
            if (uVar3 == 0) {
              uVar3 = ref_mpi_blindsend(pRVar2,proc,local_108,1,uVar12,&donor_ret,&n_donor,1);
              if (uVar3 == 0) {
                uVar3 = ref_mpi_blindsend(pRVar2,proc,local_100,1,uVar12,&donor_node,&n_donor,1);
                pvVar6 = local_118;
                if (uVar3 == 0) {
                  uVar3 = ref_mpi_blindsend(pRVar2,proc,local_118,4,uVar12,&donor_bary,&n_donor,3);
                  if (uVar3 == 0) {
                    free(proc);
                    free(local_108);
                    free(local_100);
                    free(local_f8);
                    free(pvVar6);
                    if (n_donor * leading_dim < 0) {
                      pcVar15 = "malloc donor_scalar of REF_DBL negative";
                      uVar10 = 0x846;
LAB_001305ba:
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,uVar10,"ref_interp_scalar",pcVar15);
                      return 1;
                    }
                    local_118 = (void *)CONCAT44(local_118._4_4_,n_donor);
                    pvVar6 = malloc((ulong)(uint)(n_donor * leading_dim) << 3);
                    if (pvVar6 == (void *)0x0) {
                      pcVar15 = "malloc donor_scalar of REF_DBL NULL";
                      uVar10 = 0x846;
                      goto LAB_0013030e;
                    }
                    uVar5 = 0;
                    if (0 < leading_dim) {
                      uVar5 = (ulong)(uint)leading_dim;
                    }
                    lVar16 = (long)leading_dim;
                    RVar4 = (int)local_118;
                    for (lVar13 = 0; lVar13 < RVar4; lVar13 = lVar13 + 1) {
                      uVar3 = ref_cell_nodes(local_e0,donor_cell[lVar13],nodes);
                      if (uVar3 != 0) {
                        pcVar15 = "node needs to be localized";
                        uVar10 = 0x84a;
                        goto LAB_00130411;
                      }
                      for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
                        *(undefined8 *)((long)pvVar6 + uVar7 * 8 + lVar13 * lVar16 * 8) = 0;
                        uVar11 = (ulong)(uint)local_e0->node_per;
                        if (local_e0->node_per < 1) {
                          uVar11 = 0;
                        }
                        dVar17 = 0.0;
                        for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
                          dVar17 = dVar17 + donor_bary
                                            [(ulong)((uint)lVar13 & 0x3fffffff) * 4 + uVar14] *
                                            local_b8[uVar7 + nodes[uVar14] * lVar16];
                          *(double *)((long)pvVar6 + uVar7 * 8 + lVar13 * lVar16 * 8) = dVar17;
                        }
                      }
                      RVar4 = n_donor;
                    }
                    free(donor_cell);
                    free(donor_bary);
                    pRVar2 = local_f0;
                    local_118 = pvVar6;
                    uVar3 = ref_mpi_blindsend(local_f0,donor_ret,pvVar6,leading_dim,n_donor,
                                              &recept_scalar,(REF_INT *)&local_11c,3);
                    if (uVar3 == 0) {
                      uVar3 = ref_mpi_blindsend(pRVar2,donor_ret,donor_node,1,n_donor,&recept_node,
                                                (REF_INT *)&local_11c,1);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x869,"ref_interp_scalar",(ulong)uVar3,"blind send node");
                        return uVar3;
                      }
                      free(local_118);
                      free(donor_node);
                      free(donor_ret);
                      uVar11 = 0;
                      pRVar9 = recept_scalar;
                      uVar7 = (ulong)local_11c;
                      if ((int)local_11c < 1) {
                        uVar7 = uVar11;
                      }
                      for (; uVar11 != uVar7; uVar11 = uVar11 + 1) {
                        iVar1 = recept_node[uVar11];
                        for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
                          if (0x7fefffffffffffff < (ulong)ABS(pRVar9[uVar14])) {
                            pcVar15 = "recept_scalar";
                            uVar10 = 0x872;
                            goto LAB_001305ba;
                          }
                          local_110[(long)(iVar1 * leading_dim) + uVar14] = pRVar9[uVar14];
                        }
                        pRVar9 = pRVar9 + lVar16;
                      }
                      free(recept_node);
                      free(recept_scalar);
                      uVar3 = ref_node_ghost_dbl(ref_node,local_110,leading_dim);
                      if (uVar3 == 0) {
                        uVar11 = 0;
                        uVar7 = (ulong)(uint)ref_node->max;
                        if (ref_node->max < 1) {
                          uVar7 = uVar11;
                        }
                        do {
                          if (uVar11 == uVar7) {
                            return 0;
                          }
                          if (-1 < ref_node->global[uVar11]) {
                            uVar14 = 0;
                            while (uVar5 != uVar14) {
                              pRVar9 = local_110 + uVar14;
                              uVar14 = uVar14 + 1;
                              if (0x7fefffffffffffff < (ulong)ABS(*pRVar9)) {
                                pcVar15 = "to_scalar ghost";
                                uVar10 = 0x885;
                                goto LAB_001305ba;
                              }
                            }
                          }
                          uVar11 = uVar11 + 1;
                          local_110 = local_110 + lVar16;
                        } while( true );
                      }
                      pcVar15 = "ghost";
                      uVar10 = 0x882;
                    }
                    else {
                      pcVar15 = "blind send bary";
                      uVar10 = 0x866;
                    }
                  }
                  else {
                    pcVar15 = "blind send bary";
                    uVar10 = 0x83e;
                  }
                }
                else {
                  pcVar15 = "blind send node";
                  uVar10 = 0x83b;
                }
              }
              else {
                pcVar15 = "blind send ret";
                uVar10 = 0x838;
              }
            }
            else {
              pcVar15 = "blind send cell";
              uVar10 = 0x835;
            }
LAB_00130411:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar10,"ref_interp_scalar",(ulong)uVar3,pcVar15);
            return uVar3;
          }
          pcVar15 = "malloc recept_proc of REF_INT NULL";
          uVar10 = 0x822;
        }
      }
    }
  }
LAB_0013030e:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar10,
         "ref_interp_scalar",pcVar15);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_scalar(REF_INTERP ref_interp, REF_INT leading_dim,
                                     REF_DBL *from_scalar, REF_DBL *to_scalar) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_MPI ref_mpi = ref_grid_mpi(to_grid);
  REF_CELL from_cell;
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_scalar, *donor_scalar, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_scalar, leading_dim * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (im = 0; im < leading_dim; im++) {
      donor_scalar[im + leading_dim * donation] = 0.0;
      for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
        donor_scalar[im + leading_dim * donation] +=
            donor_bary[ibary + 4 * donation] *
            from_scalar[im + leading_dim * nodes[ibary]];
      }
      /*
      RAB(isfinite(donor_scalar[im + leading_dim * donation]), "donor_scalar", {
        printf("%.20e\n", donor_scalar[im + leading_dim * donation]);
        for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
          printf("%.20e %.20e %.20e\n",
                 donor_bary[ibary + 4 * donation] *
                     from_scalar[im + leading_dim * nodes[ibary]],
                 donor_bary[ibary + 4 * donation],
                 from_scalar[im + leading_dim * nodes[ibary]]);
        }
      });
      */
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_scalar, leading_dim,
                        n_donor, (void **)(&recept_scalar), &n_recept,
                        REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_scalar);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(recept_scalar[im + leading_dim * receptor]),
          "recept_scalar");
      to_scalar[im + leading_dim * node] =
          recept_scalar[im + leading_dim * receptor];
    }
  }

  ref_free(recept_node);
  ref_free(recept_scalar);

  /*
  each_ref_node_valid_node(to_node, node) {
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(to_scalar[im + leading_dim * node]), "to_scalar local");
    }
  }
  */
  RSS(ref_node_ghost_dbl(to_node, to_scalar, leading_dim), "ghost");
  each_ref_node_valid_node(to_node, node) {
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(to_scalar[im + leading_dim * node]), "to_scalar ghost");
    }
  }

  return REF_SUCCESS;
}